

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

int __thiscall google::protobuf::FieldDescriptorProto::ByteSize(FieldDescriptorProto *this)

{
  bool bVar1;
  int32 value;
  FieldDescriptorProto_Label value_00;
  FieldDescriptorProto_Type value_01;
  int iVar2;
  string *psVar3;
  FieldOptions *value_02;
  UnknownFieldSet *pUVar4;
  int local_14;
  int total_size;
  FieldDescriptorProto *this_local;
  
  local_14 = 0;
  if ((this->_has_bits_[0] & 0xff) != 0) {
    bVar1 = has_name(this);
    if (bVar1) {
      psVar3 = name_abi_cxx11_(this);
      local_14 = internal::WireFormatLite::StringSize(psVar3);
      local_14 = local_14 + 1;
    }
    bVar1 = has_number(this);
    if (bVar1) {
      value = number(this);
      iVar2 = internal::WireFormatLite::Int32Size(value);
      local_14 = iVar2 + 1 + local_14;
    }
    bVar1 = has_label(this);
    if (bVar1) {
      value_00 = label(this);
      iVar2 = internal::WireFormatLite::EnumSize(value_00);
      local_14 = iVar2 + 1 + local_14;
    }
    bVar1 = has_type(this);
    if (bVar1) {
      value_01 = type(this);
      iVar2 = internal::WireFormatLite::EnumSize(value_01);
      local_14 = iVar2 + 1 + local_14;
    }
    bVar1 = has_type_name(this);
    if (bVar1) {
      psVar3 = type_name_abi_cxx11_(this);
      iVar2 = internal::WireFormatLite::StringSize(psVar3);
      local_14 = iVar2 + 1 + local_14;
    }
    bVar1 = has_extendee(this);
    if (bVar1) {
      psVar3 = extendee_abi_cxx11_(this);
      iVar2 = internal::WireFormatLite::StringSize(psVar3);
      local_14 = iVar2 + 1 + local_14;
    }
    bVar1 = has_default_value(this);
    if (bVar1) {
      psVar3 = default_value_abi_cxx11_(this);
      iVar2 = internal::WireFormatLite::StringSize(psVar3);
      local_14 = iVar2 + 1 + local_14;
    }
    bVar1 = has_options(this);
    if (bVar1) {
      value_02 = options(this);
      iVar2 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::FieldOptions>
                        (value_02);
      local_14 = iVar2 + 1 + local_14;
    }
  }
  pUVar4 = unknown_fields(this);
  bVar1 = UnknownFieldSet::empty(pUVar4);
  if (!bVar1) {
    pUVar4 = unknown_fields(this);
    iVar2 = internal::WireFormat::ComputeUnknownFieldsSize(pUVar4);
    local_14 = iVar2 + local_14;
  }
  this->_cached_size_ = local_14;
  return local_14;
}

Assistant:

int FieldDescriptorProto::ByteSize() const {
  int total_size = 0;

  if (_has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    // optional string name = 1;
    if (has_name()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->name());
    }

    // optional int32 number = 3;
    if (has_number()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->number());
    }

    // optional .google.protobuf.FieldDescriptorProto.Label label = 4;
    if (has_label()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->label());
    }

    // optional .google.protobuf.FieldDescriptorProto.Type type = 5;
    if (has_type()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->type());
    }

    // optional string type_name = 6;
    if (has_type_name()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->type_name());
    }

    // optional string extendee = 2;
    if (has_extendee()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->extendee());
    }

    // optional string default_value = 7;
    if (has_default_value()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->default_value());
    }

    // optional .google.protobuf.FieldOptions options = 8;
    if (has_options()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->options());
    }

  }
  if (!unknown_fields().empty()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = total_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}